

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SelectPrep(Parse *pParse,Select *p,NameContext *pOuterNC)

{
  sqlite3 *psVar1;
  Walker local_58;
  
  if (p != (Select *)0x0) {
    psVar1 = pParse->db;
    if ((psVar1->mallocFailed == '\0') && ((p->selFlags & 0x20) == 0)) {
      local_58.walkerDepth = 0;
      local_58.bSelectDepthFirst = '\0';
      local_58._29_3_ = 0;
      local_58.u.pNC = (NameContext *)0x0;
      local_58.xSelectCallback = convertCompoundSelectToSubquery;
      local_58.xExprCallback = exprWalkNoop;
      local_58.pParse = pParse;
      sqlite3WalkSelect(&local_58,p);
      local_58.xSelectCallback = selectExpander;
      sqlite3WalkSelect(&local_58,p);
      if ((pParse->nErr == 0) && (psVar1->mallocFailed == '\0')) {
        local_58.walkerDepth = 0;
        local_58.bSelectDepthFirst = '\0';
        local_58._29_3_ = 0;
        local_58.xExprCallback = resolveExprStep;
        local_58.xSelectCallback = resolveSelectStep;
        local_58.pParse = pParse;
        local_58.u.pNC = pOuterNC;
        sqlite3WalkSelect(&local_58,p);
        if ((pParse->nErr == 0) && (psVar1->mallocFailed == '\0')) {
          local_58.u.pNC = (NameContext *)0x0;
          local_58.xSelectCallback = selectAddSubqueryTypeInfo;
          local_58.xExprCallback = exprWalkNoop;
          local_58.walkerDepth = 0;
          local_58.bSelectDepthFirst = '\x01';
          local_58._29_3_ = 0;
          local_58.pParse = pParse;
          sqlite3WalkSelect(&local_58,p);
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectPrep(
  Parse *pParse,         /* The parser context */
  Select *p,             /* The SELECT statement being coded. */
  NameContext *pOuterNC  /* Name context for container */
){
  sqlite3 *db;
  if( NEVER(p==0) ) return;
  db = pParse->db;
  if( db->mallocFailed ) return;
  if( p->selFlags & SF_HasTypeInfo ) return;
  sqlite3SelectExpand(pParse, p);
  if( pParse->nErr || db->mallocFailed ) return;
  sqlite3ResolveSelectNames(pParse, p, pOuterNC);
  if( pParse->nErr || db->mallocFailed ) return;
  sqlite3SelectAddTypeInfo(pParse, p);
}